

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_uint8 *p;
  mz_uint m_bit_flag;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  uint local_18;
  long local_8;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    local_8 = 0;
  }
  else {
    local_8 = (long)(pZip->m_pState->m_central_dir).m_p +
              (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                              (ulong)file_index * 4);
  }
  if (local_8 == 0) {
    local_18 = 0;
  }
  else {
    local_18 = *(byte *)(local_8 + 8) & 1;
  }
  return local_18;
}

Assistant:

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,
                                        mz_uint file_index) {
  mz_uint m_bit_flag;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if (!p)
    return MZ_FALSE;
  m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  return (m_bit_flag & 1);
}